

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fImplementationLimitTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::LimitQueryCase<deqp::gles3::Functional::LimitQuery::NegInt>::iterate
          (LimitQueryCase<deqp::gles3::Functional::LimitQuery::NegInt> *this)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  char *description;
  MessageBuilder local_4b0;
  MessageBuilder local_330;
  MessageBuilder local_1a0;
  byte local_1d;
  NegInt local_1c;
  bool isOk;
  long lStack_18;
  NegInt value;
  Functions *gl;
  LimitQueryCase<deqp::gles3::Functional::LimitQuery::NegInt> *this_local;
  
  pRVar2 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_18 = CONCAT44(extraout_var,iVar1);
  pRVar2 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  local_1c = LimitQuery::query<deqp::gles3::Functional::LimitQuery::NegInt>
                       ((Functions *)CONCAT44(extraout_var_00,iVar1),this->m_limit);
  err = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(err,"Query failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fImplementationLimitTests.cpp"
                  ,0xf4);
  local_1d = LimitQuery::compare<deqp::gles3::Functional::LimitQuery::NegInt>
                       (&this->m_minRequiredValue,&local_1c);
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1a0,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_1a0,(char (*) [11])"Reported: ");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_1c);
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_330,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_330,(char (*) [19])"Minimum required: ");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&this->m_minRequiredValue);
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_330);
  if ((local_1d & 1) == 0) {
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_4b0,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<(&local_4b0,(char (*) [7])"FAIL: ");
    pMVar4 = tcu::MessageBuilder::operator<<
                       (pMVar4,&LimitQuery::
                                QueryClassTraits<(deqp::gles3::Functional::LimitQuery::QueryClass)0>
                                ::s_errorDescription);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4b0);
  }
  description = "Requirement not satisfied";
  if ((local_1d & 1) != 0) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (uint)((local_1d & 1) == 0),description);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
		const T					value	= query<T>(m_context.getRenderContext().getFunctions(), m_limit);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Query failed");

		const bool isOk = compare<T>(m_minRequiredValue, value);

		m_testCtx.getLog() << TestLog::Message << "Reported: " << value << TestLog::EndMessage;
		m_testCtx.getLog() << TestLog::Message << "Minimum required: " << m_minRequiredValue << TestLog::EndMessage;

		if (!isOk)
			m_testCtx.getLog() << TestLog::Message << "FAIL: " << QueryClassTraits<(QueryClass)QueryTypeTraits<T>::CLASS>::s_errorDescription << TestLog::EndMessage;

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Requirement not satisfied");
		return STOP;
	}